

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest_extensions.cpp
# Opt level: O3

bool __thiscall extensions::ExitedOrKilled::operator()(ExitedOrKilled *this,int value)

{
  bool bVar1;
  
  bVar1 = testing::ExitedWithCode::operator()(&this->_exitedWithCode,value);
  if (bVar1) {
    return true;
  }
  bVar1 = testing::KilledBySignal::operator()(&this->_killedBySignal,value);
  return bVar1;
}

Assistant:

bool ExitedOrKilled::operator()(int value) const {
        return _exitedWithCode(value) ||
#ifndef _WIN32
            _killedBySignal(value);
#else
        false;
#endif
    }